

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_perf.c
# Opt level: O0

double INT_CMprobe_bandwidth(CMConnection conn,long size,attr_list attrs)

{
  undefined1 auVar1 [16];
  char *pcVar2;
  int iVar3;
  __pid_t _Var4;
  long lVar5;
  pthread_t pVar6;
  size_t in_RSI;
  long *in_RDI;
  timespec ts_2;
  timespec ts_1;
  timespec ts;
  char *new_block_1;
  char *new_block;
  FFSEncodeVec tmp_vec [1];
  double bandwidth;
  long actual;
  double secs_to_receive;
  int repeat_count;
  int cond;
  int i;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  void *in_stack_ffffffffffffff30;
  CMConnection in_stack_ffffffffffffff38;
  FILE *pFVar7;
  CManager in_stack_ffffffffffffff40;
  long in_stack_ffffffffffffff48;
  FFSEncodeVector in_stack_ffffffffffffff50;
  CManager in_stack_ffffffffffffff58;
  CMConnection in_stack_ffffffffffffff60;
  undefined4 local_98;
  CMTraceType in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  timespec local_88;
  timespec local_78;
  char *local_68;
  char *local_60;
  char *local_58;
  size_t local_50;
  double local_48;
  long local_40;
  double local_38;
  uint local_2c;
  int local_28;
  int local_24;
  size_t local_18;
  long *local_10;
  double local_8;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = SUB168(SEXT816(100000),8);
  local_2c = SUB164((auVar1 << 0x40 | ZEXT816(100000)) / SEXT816((long)in_RSI),0);
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = INT_CMCondition_get(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if ((long)local_18 < 0x18) {
    local_18 = 0x18;
  }
  if ((int)local_2c < 10) {
    local_2c = 10;
  }
  if (INT_CMprobe_bandwidth::max_block_size == 0) {
    local_60 = (char *)INT_CMmalloc((size_t)in_stack_ffffffffffffff30);
    if (local_60 == (char *)0x0) {
      return -1.0;
    }
    INT_CMprobe_bandwidth::max_block_size = local_18;
    INT_CMprobe_bandwidth::block = local_60;
    memset(local_60,0xef,local_18);
  }
  else if (INT_CMprobe_bandwidth::max_block_size < (long)local_18) {
    local_68 = (char *)INT_CMrealloc(in_stack_ffffffffffffff30,
                                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (local_68 == (char *)0x0) {
      return -1.0;
    }
    INT_CMprobe_bandwidth::max_block_size = local_18;
    INT_CMprobe_bandwidth::block = local_68;
    memset(local_68,0xef,local_18);
  }
  pcVar2 = INT_CMprobe_bandwidth::block;
  pcVar2[0] = '\0';
  pcVar2[1] = 'P';
  pcVar2[2] = 'M';
  pcVar2[3] = 'C';
  *(uint *)(INT_CMprobe_bandwidth::block + 4) = (uint)(local_18 >> 0x20) & 0xffffff | 0xf2000000;
  *(int *)(INT_CMprobe_bandwidth::block + 8) = (int)local_18;
  *(int *)(INT_CMprobe_bandwidth::block + 0xc) = local_28;
  INT_CMCondition_set_client_data
            (in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
             in_stack_ffffffffffffff30);
  iVar3 = CMtrace_val[5];
  if (*(long *)(*local_10 + 0x120) == 0) {
    iVar3 = CMtrace_init((CManager)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         in_stack_ffffffffffffff6c);
  }
  if (iVar3 != 0) {
    if (CMtrace_PID != 0) {
      in_stack_ffffffffffffff58 = *(CManager *)(*local_10 + 0x120);
      _Var4 = getpid();
      in_stack_ffffffffffffff60 = (CMConnection)(long)_Var4;
      pVar6 = pthread_self();
      fprintf((FILE *)in_stack_ffffffffffffff58,"P%lxT%lx - ",in_stack_ffffffffffffff60,pVar6);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_78);
      fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",local_78.tv_sec,local_78.tv_nsec);
    }
    fprintf(*(FILE **)(*local_10 + 0x120),
            "CM - Initiating bandwidth probe of %ld bytes, %d messages\n",local_18,(ulong)local_2c);
  }
  fflush(*(FILE **)(*local_10 + 0x120));
  local_58 = INT_CMprobe_bandwidth::block;
  local_50 = local_18;
  iVar3 = INT_CMwrite_raw(in_stack_ffffffffffffff60,(FFSEncodeVector)in_stack_ffffffffffffff58,
                          in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                          (size_t)in_stack_ffffffffffffff40,(attr_list)in_stack_ffffffffffffff38,
                          in_stack_ffffffffffffff70);
  if (iVar3 == 1) {
    *(uint *)(INT_CMprobe_bandwidth::block + 4) =
         *(uint *)(INT_CMprobe_bandwidth::block + 4) & 0xffffff | 0xf3000000;
    for (local_24 = 0; local_40 = 1, local_24 < (int)(local_2c - 1); local_24 = local_24 + 1) {
      iVar3 = INT_CMwrite_raw(in_stack_ffffffffffffff60,(FFSEncodeVector)in_stack_ffffffffffffff58,
                              in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                              (size_t)in_stack_ffffffffffffff40,(attr_list)in_stack_ffffffffffffff38
                              ,in_stack_ffffffffffffff70);
      if (iVar3 != 1) {
        return -1.0;
      }
    }
    *(uint *)(INT_CMprobe_bandwidth::block + 4) =
         *(uint *)(INT_CMprobe_bandwidth::block + 4) & 0xffffff | 0xf4000000;
    iVar3 = INT_CMwrite_raw(in_stack_ffffffffffffff60,(FFSEncodeVector)in_stack_ffffffffffffff58,
                            in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                            (size_t)in_stack_ffffffffffffff40,(attr_list)in_stack_ffffffffffffff38,
                            in_stack_ffffffffffffff70);
    local_40 = (long)iVar3;
    if (local_40 == 1) {
      INT_CMCondition_wait
                (in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
      iVar3 = CMtrace_val[5];
      if (*(long *)(*local_10 + 0x120) == 0) {
        iVar3 = CMtrace_init((CManager)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                             ,in_stack_ffffffffffffff6c);
      }
      if (iVar3 != 0) {
        if (CMtrace_PID != 0) {
          pFVar7 = *(FILE **)(*local_10 + 0x120);
          _Var4 = getpid();
          lVar5 = (long)_Var4;
          pVar6 = pthread_self();
          fprintf(pFVar7,"P%lxT%lx - ",lVar5,pVar6);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_88);
          fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",local_88.tv_sec,local_88.tv_nsec);
        }
        fprintf(*(FILE **)(*local_10 + 0x120),"CM - Completed bandwidth probe - result %g seconds\n"
                ,local_38);
      }
      fflush(*(FILE **)(*local_10 + 0x120));
      local_48 = ((double)(long)local_18 * (double)(int)local_2c) / local_38;
      iVar3 = CMtrace_val[5];
      if (*(long *)(*local_10 + 0x120) == 0) {
        iVar3 = CMtrace_init((CManager)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                             ,in_stack_ffffffffffffff6c);
      }
      if (iVar3 != 0) {
        if (CMtrace_PID != 0) {
          pFVar7 = *(FILE **)(*local_10 + 0x120);
          _Var4 = getpid();
          lVar5 = (long)_Var4;
          pVar6 = pthread_self();
          fprintf(pFVar7,"P%lxT%lx - ",lVar5,pVar6);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&local_98);
          fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",
                  CONCAT44(in_stack_ffffffffffffff6c,local_98),
                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        }
        fprintf(*(FILE **)(*local_10 + 0x120),"CM - Estimated bandwidth - %g Mbites/sec\n",
                (local_48 / 1000.0) * 1000.0 * 8.0);
      }
      fflush(*(FILE **)(*local_10 + 0x120));
      local_8 = local_48;
    }
    else {
      local_8 = -1.0;
    }
  }
  else {
    local_8 = -1.0;
  }
  return local_8;
}

Assistant:

extern double
INT_CMprobe_bandwidth(CMConnection conn, long size, attr_list attrs)
{
    int i;
    int cond;
    int repeat_count = 100000/size;  /* send about 100K */
    static long max_block_size = 0;
    static char *block = NULL;
    double secs_to_receive;
    long actual;
    double bandwidth;
    struct FFSEncodeVec tmp_vec[1];


    cond = INT_CMCondition_get(conn->cm, conn);

    if (size < 24) size = 24;
    if (repeat_count < 10) repeat_count = 10;
    if (max_block_size == 0) {
	char *new_block = malloc(size);
	if (new_block == NULL) return -1;
	block = new_block;
	max_block_size = size;
	memset(block, 0xef, size);
    } else if (size > max_block_size) {
	char *new_block = realloc(block, size);
	if (new_block == NULL) return -1;
	block = new_block;
	max_block_size = size;
	memset(block, 0xef, size);
    }
    
    /* CMP\0 in first entry for CMPerformance message */
    ((int*)block)[0] = 0x434d5000;
    /* size in second entry, high byte gives CMPerf operation */
#if SIZEOF_LONG == 4
    ((int*)block)[1] = 0 | (CMPerfBandwidthInit<<24);
    ((int*)block)[2] = size;
#else
    ((int*)block)[1] = ((size >> 32) &0xffffff) | (CMPerfBandwidthInit<<24);
    ((int*)block)[2] = (size & 0xffffffff);
#endif
    ((int*)block)[3] = cond;   /* condition value in third entry */
    
    INT_CMCondition_set_client_data( conn->cm, cond, &secs_to_receive);

    CMtrace_out(conn->cm, CMTransportVerbose, "CM - Initiating bandwidth probe of %ld bytes, %d messages\n", size, repeat_count);
    tmp_vec[0].iov_base = &block[0];
    tmp_vec[0].iov_len = size;
    actual = INT_CMwrite_raw(conn, tmp_vec, NULL, 1, size, NULL, 0);
    if (actual != 1) { 
	return -1;
    }

    ((int*)block)[1] = (((int*)block)[1]&0xffffff) | (CMPerfBandwidthBody<<24);
    for (i=0; i <(repeat_count-1); i++) {
	actual = INT_CMwrite_raw(conn, tmp_vec, NULL, 1, size, NULL, 0);
	if (actual != 1) {
	    return -1;
	}
    }

    ((int*)block)[1] = (((int*)block)[1]&0xffffff) | (CMPerfBandwidthEnd<<24);
    actual = INT_CMwrite_raw(conn, tmp_vec, NULL, 1, size, NULL, 0);
    if (actual != 1) {
	return -1;
    }

    INT_CMCondition_wait(conn->cm, cond);
    CMtrace_out(conn->cm, CMTransportVerbose, "CM - Completed bandwidth probe - result %g seconds\n", secs_to_receive);
    bandwidth = ((double) size * (double)repeat_count) / secs_to_receive;
    CMtrace_out(conn->cm, CMTransportVerbose, "CM - Estimated bandwidth - %g Mbites/sec\n", bandwidth / 1000.0 * 1000.0 * 8);
    return  bandwidth;
}